

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotprecv.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ssize_t sVar5;
  char **in_RSI;
  int in_EDI;
  int elements_1;
  int elements;
  int nbytes;
  uchar msg [67000];
  int loop;
  __u32 force_rx_stmin;
  int i;
  int opt;
  sockaddr_can addr;
  int s;
  byte abStack_105f8 [67004];
  undefined4 local_3c;
  int local_38;
  uint local_34;
  sockaddr local_30;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_3c = 0;
  bVar1 = false;
  local_30.sa_data[6] = -1;
  local_30.sa_data[7] = -1;
  local_30.sa_data[8] = -1;
  local_30.sa_data[9] = -1;
  local_30.sa_data[10] = -1;
  local_30.sa_data[0xb] = -1;
  local_30.sa_data[0xc] = -1;
  local_30.sa_data[0xd] = -1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_34 = getopt(local_8,local_10,"s:d:x:p:P:b:m:w:f:lL:?"), local_34 != 0xffffffff) {
    switch(local_34) {
    case 0x3f:
      __xpg_basename(*local_10);
      print_usage((char *)0x101857);
      exit(0);
    default:
      fprintf(_stderr,"Unknown option %c\n",(ulong)local_34);
      __xpg_basename(*local_10);
      print_usage((char *)0x101895);
      exit(1);
    case 0x4c:
      iVar2 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1040b4,0x1040b5);
      if (iVar2 != 3) {
        printf("unknown link layer options \'%s\'.\n",_optarg);
        __xpg_basename(*local_10);
        print_usage((char *)0x101836);
        exit(0);
      }
      break;
    case 0x50:
      if (*_optarg == 'l') {
        main::opts.flags = main::opts.flags | 0x10;
      }
      else if (*_optarg == 'c') {
        main::opts.flags = main::opts.flags | 0x20;
      }
      else {
        if (*_optarg != 'a') {
          printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)*_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x101704);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 0x30;
      }
      break;
    case 0x62:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.bs = (__u8)uVar4;
      break;
    case 100:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      local_30.sa_data._6_4_ = SUB84(uVar4,0);
      sVar3 = strlen(_optarg);
      if (7 < sVar3) {
        local_30.sa_data._6_4_ = local_30.sa_data._6_4_ | 0x80000000;
      }
      break;
    case 0x66:
      main::opts.flags = main::opts.flags | 0x100;
      uVar4 = strtoul(_optarg,(char **)0x0,10);
      local_3c = (undefined4)uVar4;
      break;
    case 0x6c:
      bVar1 = true;
      break;
    case 0x6d:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.stmin = (__u8)uVar4;
      break;
    case 0x70:
      iVar2 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040ad,0x1040ae);
      if (iVar2 == 1) {
        main::opts.flags = main::opts.flags | 4;
      }
      else if (iVar2 == 2) {
        main::opts.flags = main::opts.flags | 0xc;
      }
      else {
        iVar2 = __isoc99_sscanf(_optarg,":%hhx",0x1040ae);
        if (iVar2 != 1) {
          printf("incorrect padding values \'%s\'.\n",_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x101655);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 8;
      }
      break;
    case 0x73:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      local_30.sa_data._10_4_ = SUB84(uVar4,0);
      sVar3 = strlen(_optarg);
      if (7 < sVar3) {
        local_30.sa_data._10_4_ = local_30.sa_data._10_4_ | 0x80000000;
      }
      break;
    case 0x77:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      main::fcopts.wftmax = (__u8)uVar4;
      break;
    case 0x78:
      iVar2 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040ac,0x1040af);
      if (iVar2 == 1) {
        main::opts.flags = main::opts.flags | 2;
      }
      else {
        if (iVar2 != 2) {
          printf("incorrect extended addr values \'%s\'.\n",_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x10157d);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 0x202;
      }
    }
  }
  if (((local_8 - _optind == 1) && (local_30.sa_data._10_4_ != 0xffffffff)) &&
     (local_30.sa_data._6_4_ != 0xffffffff)) {
    local_14 = socket(0x1d,2,6);
    if (local_14 < 0) {
      perror("socket");
      exit(1);
    }
    setsockopt(local_14,0x6a,1,&main::opts,0xc);
    setsockopt(local_14,0x6a,2,&main::fcopts,3);
    if ((main::llopts.tx_dl != '\0') &&
       (iVar2 = setsockopt(local_14,0x6a,5,&main::llopts,3), iVar2 < 0)) {
      perror("link layer sockopt");
      exit(1);
    }
    if ((main::opts.flags & 0x100) != 0) {
      setsockopt(local_14,0x6a,4,&local_3c,4);
    }
    local_30.sa_family = 0x1d;
    local_30.sa_data._2_4_ = if_nametoindex(local_10[_optind]);
    if (local_30.sa_data._2_4_ == 0) {
      perror("if_nametoindex");
      exit(1);
    }
    iVar2 = bind(local_14,&local_30,0x18);
    if (iVar2 < 0) {
      perror("bind");
      close(local_14);
      exit(1);
    }
    do {
      sVar5 = read(local_14,abStack_105f8,67000);
      iVar2 = (int)sVar5;
      if ((0 < iVar2) && (iVar2 < 67000)) {
        for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
          printf("%02X ",(ulong)abStack_105f8[local_38]);
        }
      }
      printf("\n");
    } while (bVar1);
    close(local_14);
    return 0;
  }
  __xpg_basename(*local_10);
  print_usage((char *)0x1018e5);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_fc_options fcopts;
    static struct can_isotp_ll_options llopts;
    int opt, i;
    extern int optind, opterr, optopt;
    __u32 force_rx_stmin = 0;
    int loop = 0;

    unsigned char msg[BUFSIZE];
    int nbytes;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:b:m:w:f:lL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'b':
		    fcopts.bs = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'm':
		    fcopts.stmin = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'w':
		    fcopts.wftmax = strtoul(optarg, NULL, 16) & 0xFF;
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_RXSTMIN;
		    force_rx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'l':
		    loop = 1;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	(addr.can_addr.tp.rx_id == NO_CAN_ID)) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }
  
    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts));
    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_RECV_FC, &fcopts, sizeof(fcopts));

    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_RXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_RX_STMIN, &force_rx_stmin, sizeof(force_rx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    do {
	    nbytes = read(s, msg, BUFSIZE);
	    if (nbytes > 0 && nbytes < BUFSIZE)
		    for (i=0; i < nbytes; i++)
			    printf("%02X ", msg[i]);
	    printf("\n");
    } while (loop);

    close(s);

    return 0;
}